

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *window;
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ImGuiWindow *pIVar8;
  ImGuiWindow *window_00;
  
  pIVar2 = GImGui;
  if (under_this_window == (ImGuiWindow *)0x0) {
    uVar7 = (GImGui->WindowsFocusOrder).Size - 1;
  }
  else {
    iVar4 = -1;
    if ((under_this_window->Flags & 0x1000000) != 0) {
      do {
        under_this_window = under_this_window->ParentWindow;
      } while ((under_this_window->Flags & 0x1000000) != 0);
      iVar4 = 0;
    }
    uVar7 = under_this_window->FocusOrder + iVar4;
  }
  if ((int)uVar7 < 0) {
    FocusWindow((ImGuiWindow *)0x0);
    return;
  }
  lVar5 = (ulong)uVar7 + 1;
  while (((pIVar8 = (GImGui->WindowsFocusOrder).Data[lVar5 + -1], pIVar8 == ignore_window ||
          (pIVar8->WasActive != true)) || ((~pIVar8->Flags & 0x40200U) == 0))) {
    lVar6 = lVar5 + -1;
    bVar1 = lVar5 < 1;
    lVar5 = lVar6;
    if (lVar6 == 0 || bVar1) {
      FocusWindow((ImGuiWindow *)0x0);
      return;
    }
  }
  window = pIVar8->NavLastChildNavWindow;
  if ((window != (ImGuiWindow *)0x0) && (window->WasActive != false)) {
    if (GImGui->NavWindow != window) {
      SetNavWindow(window);
      if (window == (ImGuiWindow *)0x0) {
        IVar3 = 0;
        pIVar2->NavId = 0;
        pIVar2->NavLayer = ImGuiNavLayer_Main;
      }
      else {
        if (pIVar2->NavDisableMouseHover == true) {
          pIVar2->NavMousePosDirty = true;
        }
        pIVar2->NavId = window->NavLastIds[0];
        pIVar2->NavLayer = ImGuiNavLayer_Main;
        IVar3 = window->NavRootFocusScopeId;
      }
      pIVar2->NavFocusScopeId = IVar3;
      pIVar2->NavIdIsAlive = false;
      ClosePopupsOverWindow(window,false);
    }
    if (window == (ImGuiWindow *)0x0) {
      pIVar8 = (ImGuiWindow *)0x0;
      window_00 = (ImGuiWindow *)0x0;
    }
    else {
      pIVar8 = window->RootWindow;
      window_00 = window->RootWindow;
    }
    if (((pIVar2->ActiveId != 0) && (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       ((pIVar2->ActiveIdWindow->RootWindow != pIVar8 &&
        (pIVar2->ActiveIdNoClearOnFocusLoss == false)))) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
    if ((window != (ImGuiWindow *)0x0) &&
       (BringWindowToFocusFront(pIVar8), ((uint)(window_00->Flags | window->Flags) >> 0xd & 1) == 0)
       ) {
      BringWindowToDisplayFront(window_00);
      return;
    }
    return;
  }
  FocusWindow(pIVar8);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        // Aim at root window behind us, if we are in a child window that's our own root (see #4640)
        int offset = -1;
        while (under_this_window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            under_this_window = under_this_window->ParentWindow;
            offset = 0;
        }
        start_idx = FindWindowFocusIndex(under_this_window) + offset;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        IM_ASSERT(window == window->RootWindow);
        if (window != ignore_window && window->WasActive)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}